

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::anon_unknown_14::parseIntOption
               (int argc,char **argv,char *pattern,optionType type,int *res)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  String *value;
  char *other;
  String parsedValue;
  anon_union_24_2_13149d16_for_String_2 local_48;
  
  value = &parsedValue;
  parsedValue.field_0.buf[0] = '\0';
  parsedValue.field_0.buf[0x17] = '\x17';
  local_48.buf[0] = '\0';
  local_48.buf[0x17] = '\x17';
  bVar1 = parseOption(argc,argv,pattern,value,(String *)&local_48.data);
  String::~String((String *)&local_48.data);
  if (bVar1) {
    if (type == option_bool) {
      other = "1";
      iVar2 = 1;
      lVar4 = 0;
      do {
        if (lVar4 + 6 == 0x1e) goto LAB_00109629;
        iVar3 = String::compare(&parsedValue,other,true);
        if (iVar3 == 0) goto LAB_00109687;
        other = other + 5;
        iVar3 = String::compare(&parsedValue,&DAT_0011c0c0 + lVar4,true);
        lVar4 = lVar4 + 6;
      } while (iVar3 != 0);
      iVar2 = 0;
    }
    else {
      if (parsedValue.field_0.buf[0x17] < '\0') {
        value = (String *)CONCAT71(parsedValue.field_0._1_7_,parsedValue.field_0.buf[0]);
      }
      iVar2 = atoi((char *)value);
      if (iVar2 == 0) goto LAB_00109629;
    }
LAB_00109687:
    *res = iVar2;
    bVar1 = true;
  }
  else {
LAB_00109629:
    bVar1 = false;
  }
  String::~String(&parsedValue);
  return bVar1;
}

Assistant:

bool parseIntOption(int argc, const char* const* argv, const char* pattern, optionType type,
                        int& res) {
        String parsedValue;
        if(!parseOption(argc, argv, pattern, &parsedValue))
            return false;

        if(type == 0) {
            // boolean
            const char positive[][5] = {"1", "true", "on", "yes"};  // 5 - strlen("true") + 1
            const char negative[][6] = {"0", "false", "off", "no"}; // 6 - strlen("false") + 1

            // if the value matches any of the positive/negative possibilities
            for(unsigned i = 0; i < 4; i++) {
                if(parsedValue.compare(positive[i], true) == 0) {
                    res = 1; //!OCLINT parameter reassignment
                    return true;
                }
                if(parsedValue.compare(negative[i], true) == 0) {
                    res = 0; //!OCLINT parameter reassignment
                    return true;
                }
            }
        } else {
            // integer
            // TODO: change this to use std::stoi or something else! currently it uses undefined behavior - assumes '0' on failed parse...
            int theInt = std::atoi(parsedValue.c_str()); // NOLINT
            if(theInt != 0) {
                res = theInt; //!OCLINT parameter reassignment
                return true;
            }
        }
        return false;
    }